

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  int iVar1;
  __pid_t _Var2;
  pid_t pid;
  color color_local;
  uint8_t progression_local;
  FILE *outf_local;
  nvamemtiming_conf *conf_local;
  
  printf("--- Start sequence number %u\n",(ulong)progression);
  iVar1 = system("rmmod nvidia");
  if (iVar1 == 0x7f) {
    fprintf(_stderr,"rmmod not found. Abort\n");
    exit(2);
  }
  iVar1 = vbios_upload_pramin(conf->cnum,(conf->vbios).data,(int)(conf->vbios).length);
  if (iVar1 == 1) {
    setenv("DISPLAY",":0",1);
    if ((conf->mmiotrace & 1U) != 0) {
      mmiotrace_start((uint)progression);
    }
    _Var2 = fork();
    if (_Var2 != 0) {
      if (_Var2 != -1) {
        iVar1 = force_timing_changes((conf->timing).perflvl,(uint)(conf->mmiotrace & 1));
        if (iVar1 == 0) {
          if ((conf->mmiotrace & 1U) != 0) {
            mmiotrace_stop();
          }
          dump_timings(conf,outf,progression,color);
          system("killall X");
          do {
            _Var2 = wait((void *)0x0);
          } while (0 < _Var2);
          conf->counter = conf->counter + 1;
          sleep(5);
          conf_local._4_4_ = 0;
        }
        else {
          conf_local._4_4_ = 1;
        }
        return conf_local._4_4_;
      }
      fprintf(_stderr,"Fork failed! Abort\n");
      exit(4);
    }
    system("killall X 2> /dev/null > /dev/null");
    system("X > /dev/null 2> /dev/null");
    fprintf(_stderr,"X exited, let\'s quit!\n");
    exit(0);
  }
  fprintf(_stderr,"upload failed. Abort\n");
  exit(3);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}